

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_791d::TENSOR_TO_INDEX_Test::TestBody(TENSOR_TO_INDEX_Test *this)

{
  bool bVar1;
  int i;
  long lVar2;
  int ret;
  int ret_1;
  int iVar3;
  char *pcVar4;
  array<unsigned_int,_3UL> size;
  AssertionResult gtest_ar;
  tensor<int,_3U> ts;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined4 local_70;
  AssertHelper local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  int local_4c;
  tensor<int,_3U> local_48;
  
  size._M_elems[2] = 4;
  size._M_elems._0_8_ = &DAT_300000002;
  dnet::data_types::tensor<int,_3U>::tensor(&local_48,size);
  local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70 = 2;
  lVar2 = 0;
  local_68.data_._0_4_ = 0;
  do {
    local_68.data_._0_4_ =
         (int)local_68.data_ +
         local_48._facts._M_elems[lVar2] * *(int *)((long)&local_78.ptr_ + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_4c = 2;
  testing::internal::CmpHelperEQ<int,int>
            (local_60,"ts.to_index({0,0,2})","12*0+4*0+1*2",(int *)&local_68,&local_4c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x42,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
      local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  iVar3 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_100000000;
  local_70 = 2;
  lVar2 = 0;
  do {
    iVar3 = iVar3 + local_48._facts._M_elems[lVar2] * *(int *)((long)&local_78.ptr_ + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_4c = 6;
  local_68.data_._0_4_ = iVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_60,"ts.to_index({0,1,2})","12*0+4*1+1*2",(int *)&local_68,&local_4c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x43,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
      local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  iVar3 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_200000001;
  local_70 = 3;
  lVar2 = 0;
  do {
    iVar3 = iVar3 + local_48._facts._M_elems[lVar2] * *(int *)((long)&local_78.ptr_ + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_4c = 0x17;
  local_68.data_._0_4_ = iVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_60,"ts.to_index({1,2,3})","12*1+4*2+1*3",(int *)&local_68,&local_4c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x44,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
      local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48._data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(TENSOR, TO_INDEX) {
        tensor<int, 3> ts({2,3,4});
        EXPECT_EQ(ts.to_index({0,0,2}), 12*0+4*0+1*2);
        EXPECT_EQ(ts.to_index({0,1,2}), 12*0+4*1+1*2);
        EXPECT_EQ(ts.to_index({1,2,3}), 12*1+4*2+1*3);
    }